

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

_Bool prof_gdump_set(tsdn_t *tsdn,_Bool gdump)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&prof_gdump_mtx.field_0 + 0x40));
  if (iVar2 != 0) {
    malloc_mutex_lock_slow(&prof_gdump_mtx);
  }
  _Var1 = prof_gdump_val;
  prof_gdump_mtx.field_0.field_0.prof_data.n_lock_ops =
       prof_gdump_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (prof_gdump_mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    prof_gdump_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(prof_gdump_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    prof_gdump_mtx.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  prof_gdump_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  prof_gdump_val = gdump;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&prof_gdump_mtx.field_0 + 0x40));
  return _Var1;
}

Assistant:

bool
prof_gdump_set(tsdn_t *tsdn, bool gdump) {
	bool prof_gdump_old;

	malloc_mutex_lock(tsdn, &prof_gdump_mtx);
	prof_gdump_old = prof_gdump_val;
	prof_gdump_val = gdump;
	malloc_mutex_unlock(tsdn, &prof_gdump_mtx);
	return prof_gdump_old;
}